

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::FinalPass(cmMakefile *this)

{
  pointer ppcVar1;
  
  ExpandVariablesCMP0019(this);
  for (ppcVar1 = (this->FinalPassCommands).
                 super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar1 !=
      (this->FinalPassCommands).super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppcVar1 = ppcVar1 + 1) {
    (*(*ppcVar1)->_vptr_cmCommand[4])();
  }
  cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,(anonymous_namespace)::file_not_persistent>
            (&this->OutputFiles);
  cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,(anonymous_namespace)::file_not_persistent>
            (&this->ListFiles);
  return;
}

Assistant:

void cmMakefile::FinalPass()
{
  // do all the variable expansions here
  this->ExpandVariablesCMP0019();

  // give all the commands a chance to do something
  // after the file has been parsed before generation
  for (std::vector<cmCommand*>::iterator i = this->FinalPassCommands.begin();
       i != this->FinalPassCommands.end(); ++i) {
    (*i)->FinalPass();
  }

  // go through all configured files and see which ones still exist.
  // we don't want cmake to re-run if a configured file is created and deleted
  // during processing as that would make it a transient file that can't
  // influence the build process
  cmEraseIf(this->OutputFiles, file_not_persistent());

  // if a configured file is used as input for another configured file,
  // and then deleted it will show up in the input list files so we
  // need to scan those too
  cmEraseIf(this->ListFiles, file_not_persistent());
}